

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  pollfd *__fds;
  int *piVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  pollfd *pfd;
  size_t sz;
  int res;
  int fd;
  int pos;
  int i;
  int rc;
  int local_2c;
  int in_stack_ffffffffffffffd8;
  int iVar2;
  int iVar3;
  int in_stack_ffffffffffffffe4;
  int local_4;
  
  __fds = (pollfd *)nn_alloc_(0x1cf0d2);
  if (__fds == (pollfd *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/poll.c"
            ,0x8c);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = 0;
  iVar3 = 0;
  do {
    if (iVar3 == in_ESI) {
      local_4 = poll(__fds,(long)iVar2,in_EDX);
      if (local_4 < 1) {
        piVar1 = __errno_location();
        iVar2 = *piVar1;
        nn_free((void *)0x1cf3a9);
        piVar1 = __errno_location();
        *piVar1 = iVar2;
      }
      else {
        local_2c = 0;
        iVar2 = 0;
        for (iVar3 = 0; iVar3 != in_ESI; iVar3 = iVar3 + 1) {
          *(undefined2 *)(in_RDI + 6 + (long)iVar3 * 8) = 0;
          if ((*(ushort *)(in_RDI + 4 + (long)iVar3 * 8) & 1) != 0) {
            if ((__fds[iVar2].revents & 1U) != 0) {
              *(ushort *)(in_RDI + 6 + (long)iVar3 * 8) =
                   *(ushort *)(in_RDI + 6 + (long)iVar3 * 8) | 1;
            }
            iVar2 = iVar2 + 1;
          }
          if ((*(ushort *)(in_RDI + 4 + (long)iVar3 * 8) & 2) != 0) {
            if ((__fds[iVar2].revents & 1U) != 0) {
              *(ushort *)(in_RDI + 6 + (long)iVar3 * 8) =
                   *(ushort *)(in_RDI + 6 + (long)iVar3 * 8) | 2;
            }
            iVar2 = iVar2 + 1;
          }
          if (*(short *)(in_RDI + 6 + (long)iVar3 * 8) != 0) {
            local_2c = local_2c + 1;
          }
        }
        nn_free((void *)0x1cf4d9);
        local_4 = local_2c;
      }
      return local_4;
    }
    if ((*(ushort *)(in_RDI + 4 + (long)iVar3 * 8) & 1) != 0) {
      in_stack_ffffffffffffffe4 =
           nn_getsockopt((int)in_RDI,in_ESI,in_EDX,(void *)CONCAT44(in_stack_ffffffffffffffe4,iVar3)
                         ,(size_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      if (in_stack_ffffffffffffffe4 < 0) {
        nn_free((void *)0x1cf1b6);
        return -1;
      }
      __fds[iVar2].fd = in_stack_ffffffffffffffd8;
      __fds[iVar2].events = 1;
      iVar2 = iVar2 + 1;
    }
    if ((*(ushort *)(in_RDI + 4 + (long)iVar3 * 8) & 2) != 0) {
      in_stack_ffffffffffffffe4 =
           nn_getsockopt((int)in_RDI,in_ESI,in_EDX,(void *)CONCAT44(in_stack_ffffffffffffffe4,iVar3)
                         ,(size_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      if (in_stack_ffffffffffffffe4 < 0) {
        nn_free((void *)0x1cf2bb);
        return -1;
      }
      __fds[iVar2].fd = in_stack_ffffffffffffffd8;
      __fds[iVar2].events = 1;
      iVar2 = iVar2 + 1;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}